

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O2

bool __thiscall ON_ParseSettings::IsSubtractionSymbol(ON_ParseSettings *this,ON__UINT32 c)

{
  return c == 0x2212 || c == 0x2d;
}

Assistant:

bool ON_ParseSettings::IsSubtractionSymbol(ON__UINT32 c) const
{
  switch(c)
  {
  case '-': // unicode hyphen minus
  case 0x2212: // unicode minus sign
    return true;
    break;
  }

  return false;
}